

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<false,float,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  SelectionVector *pSVar2;
  value_type vVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  const_reference pvVar7;
  sel_t *psVar8;
  ulong uVar9;
  idx_t iVar10;
  idx_t iVar11;
  ulong uVar12;
  idx_t iVar13;
  ulong uVar14;
  uint uVar15;
  idx_t iVar16;
  bool bVar17;
  float local_48;
  float local_44;
  ulong local_40;
  data_ptr_t local_38;
  
  local_40 = col_idx >> 3;
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar2 = (lhs_format->unified).sel;
    pdVar1 = (lhs_format->unified).data;
    pdVar6 = rhs_row_locations->data;
    pvVar7 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar3 = *pvVar7;
      iVar13 = 0;
      uVar12 = 0;
      do {
        uVar14 = uVar12;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar14 = (ulong)sel->sel_vector[uVar12];
        }
        psVar8 = pSVar2->sel_vector;
        uVar9 = uVar14;
        if (psVar8 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar8[uVar14];
        }
        local_48 = *(float *)(*(long *)(pdVar6 + uVar14 * 8) + vVar3);
        if (((1 << ((byte)col_idx & 7) & (uint)*(byte *)(*(long *)(pdVar6 + uVar14 * 8) + local_40))
             != 0) &&
           (bVar17 = Equals::Operation<float>((float *)(pdVar1 + uVar9 * 4),&local_48), bVar17)) {
          sel->sel_vector[iVar13] = (sel_t)uVar14;
          iVar13 = iVar13 + 1;
        }
        uVar12 = uVar12 + 1;
      } while (count != uVar12);
      return iVar13;
    }
  }
  else {
    pdVar1 = rhs_row_locations->data;
    pSVar2 = (lhs_format->unified).sel;
    local_38 = (lhs_format->unified).data;
    pvVar7 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar3 = *pvVar7;
      iVar16 = 0;
      iVar13 = 0;
      do {
        psVar8 = sel->sel_vector;
        iVar11 = iVar13;
        if (psVar8 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar8[iVar13];
        }
        psVar4 = pSVar2->sel_vector;
        iVar10 = iVar11;
        if (psVar4 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar4[iVar11];
        }
        puVar5 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                 validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar17 = false;
        }
        else {
          bVar17 = (puVar5[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0;
        }
        uVar15 = (uint)*(byte *)(*(long *)(pdVar1 + iVar11 * 8) + local_40) &
                 1 << ((byte)col_idx & 7);
        local_44 = *(float *)(*(long *)(pdVar1 + iVar11 * 8) + vVar3);
        if ((bVar17 == false) && (uVar15 != 0)) {
          bVar17 = Equals::Operation<float>((float *)(local_38 + iVar10 * 4),&local_44);
          if (bVar17) {
            psVar8 = sel->sel_vector;
LAB_00aec243:
            psVar8[iVar16] = (sel_t)iVar11;
            iVar16 = iVar16 + 1;
          }
        }
        else if (bVar17 == (uVar15 == 0)) goto LAB_00aec243;
        iVar13 = iVar13 + 1;
        if (count == iVar13) {
          return iVar16;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}